

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

vbignum_t * __thiscall vbignum_t::operator%(vbignum_t *this,vbignum_t *b)

{
  uint uVar1;
  vbignum_t *pvVar2;
  vbignum_t quo;
  vbignum_t *res;
  char *in_stack_00000178;
  char *in_stack_00000180;
  char *in_stack_00000188;
  char *in_stack_00000190;
  vbignum_t *in_stack_ffffffffffffffa8;
  vbignum_t local_30 [3];
  vbignum_t *local_18;
  
  pvVar2 = (vbignum_t *)operator_new(8);
  vbignum_t(pvVar2);
  local_18 = pvVar2;
  vbignum_t(local_30);
  pvVar2 = local_18;
  uVar1 = maxprec(local_18,in_stack_ffffffffffffffa8);
  init(pvVar2,(EVP_PKEY_CTX *)(ulong)uVar1);
  init(local_30,(EVP_PKEY_CTX *)0x2);
  CVmObjBigNum::compute_quotient_into
            (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  ~vbignum_t(pvVar2);
  return local_18;
}

Assistant:

vbignum_t *operator %(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t(), quo;
        res->init(maxprec(this, &b));
        quo.init(2);
        CVmObjBigNum::compute_quotient_into(quo.ext_, res->ext_, ext_, b.ext_);
        return res;
    }